

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_checkfinalizer(lua_State *L,GCObject *o,Table *mt)

{
  global_State *pgVar1;
  GCObject **ppGVar2;
  TValue *local_40;
  TValue *local_38;
  GCObject *local_30;
  GCObject **p;
  global_State *g;
  Table *mt_local;
  GCObject *o_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if ((o->marked & 8) == 0) {
    if (mt == (Table *)0x0) {
      local_38 = (TValue *)0x0;
    }
    else {
      if ((mt->flags & 4) == 0) {
        local_40 = luaT_gettm(mt,TM_GC,pgVar1->tmname[2]);
      }
      else {
        local_40 = (TValue *)0x0;
      }
      local_38 = local_40;
    }
    if (local_38 != (TValue *)0x0) {
      if (((1 < pgVar1->gcstate) && (pgVar1->gcstate < 6)) &&
         (o->marked = o->marked & 0xf8 | pgVar1->currentwhite & 3, (GCObject *)pgVar1->sweepgc == o)
         ) {
        ppGVar2 = sweeptolive(L,pgVar1->sweepgc);
        pgVar1->sweepgc = ppGVar2;
      }
      for (local_30 = (GCObject *)&pgVar1->allgc; local_30->next != o; local_30 = local_30->next) {
      }
      local_30->next = o->next;
      o->next = pgVar1->finobj;
      pgVar1->finobj = o;
      o->marked = o->marked | 8;
    }
  }
  return;
}

Assistant:

void luaC_checkfinalizer (lua_State *L, GCObject *o, Table *mt) {
  global_State *g = G(L);
  if (tofinalize(o) ||                 /* obj. is already marked... */
      gfasttm(g, mt, TM_GC) == NULL)   /* or has no finalizer? */
    return;  /* nothing to be done */
  else {  /* move 'o' to 'finobj' list */
    GCObject **p;
    if (issweepphase(g)) {
      makewhite(g, o);  /* "sweep" object 'o' */
      if (g->sweepgc == &o->next)  /* should not remove 'sweepgc' object */
        g->sweepgc = sweeptolive(L, g->sweepgc);  /* change 'sweepgc' */
    }
    else {  /* correct pointers into 'allgc' list, if needed */
      if (o == g->survival)
        g->survival = o->next;
      if (o == g->old)
        g->old = o->next;
      if (o == g->reallyold)
        g->reallyold = o->next;
    }
    /* search for pointer pointing to 'o' */
    for (p = &g->allgc; *p != o; p = &(*p)->next) { /* empty */ }
    *p = o->next;  /* remove 'o' from 'allgc' list */
    o->next = g->finobj;  /* link it in 'finobj' list */
    g->finobj = o;
    l_setbit(o->marked, FINALIZEDBIT);  /* mark it as such */
  }
}